

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

void __thiscall inja::Renderer::render_to(Renderer *this,ostream *os,Template *tmpl,json *data)

{
  Bytecode *bc;
  pointer ppbVar1;
  value_t vVar2;
  Op OVar3;
  pointer pbVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
  *this_00;
  array_t *paVar5;
  object_t *poVar6;
  pointer pcVar7;
  pointer ppVar8;
  string_view name;
  size_type sVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  char cVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  pointer pBVar17;
  json *pjVar18;
  const_iterator cVar19;
  ulong uVar20;
  uint *puVar21;
  long lVar22;
  reference pbVar23;
  long *plVar24;
  const_reference pvVar25;
  undefined8 *puVar26;
  pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
  *ppVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  key_type *__args;
  reference pbVar29;
  reference this_01;
  vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  *pvVar30;
  undefined8 uVar31;
  uint uVar32;
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  *this_02;
  ulong uVar33;
  long *plVar34;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar35;
  pointer ppVar36;
  undefined1 uVar37;
  char cVar38;
  pointer pLVar39;
  LoopLevel *pLVar40;
  json_value *this_03;
  json_value jVar41;
  pointer ppbVar42;
  uint uVar43;
  ulong uVar44;
  double dVar45;
  json_value jVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar50;
  undefined1 auVar49 [16];
  int iVar51;
  undefined1 auVar52 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  result_11;
  iterator end;
  iterator parent_loop_it;
  vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  args_12;
  bool result_29;
  bool result_32;
  const_iterator result_34;
  const_iterator result_33;
  const_iterator result_13;
  const_iterator result_12;
  const_iterator result_22;
  const_iterator result_21;
  json_value local_2b8;
  json_value jStack_2b0;
  pointer local_2a8;
  json_value jStack_2a0;
  json_value local_298;
  json_value jStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_288;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_268;
  vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_> local_250;
  pointer local_230;
  undefined1 local_218 [16];
  json_value local_208;
  long local_200;
  pointer local_1f8;
  undefined8 uStack_1f0;
  json_value local_1e8;
  new_allocator<inja::Renderer::LoopLevel> *local_1e0;
  json_value local_1d8;
  ostream *local_1d0;
  json_value local_1c8;
  json_value jStack_1c0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1b8;
  json *local_1a0;
  pointer *local_198;
  uint local_190;
  undefined4 uStack_18c;
  pointer local_188 [2];
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  Template *local_158;
  undefined1 local_150 [8];
  json_value local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  json_value local_118;
  undefined1 local_110 [8];
  json_value local_108;
  undefined1 local_100 [8];
  json_value local_f8;
  json_value local_f0;
  object_t *poStack_e8;
  size_type sStack_e0;
  undefined8 uStack_d8;
  json_value local_d0;
  _Base_ptr p_Stack_c8;
  pointer pbStack_c0;
  number_integer_t nStack_b8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  this->m_data = data;
  pBVar17 = (tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar17) {
    local_1e0 = (new_allocator<inja::Renderer::LoopLevel> *)&this->m_loop_stack;
    this_02 = &this->m_stack;
    uVar44 = 0;
    local_1d0 = os;
    local_1a0 = data;
    local_158 = tmpl;
    do {
      jVar41.object = (object_t *)&local_1f8;
      bc = pBVar17 + uVar44;
      switch(pBVar17[uVar44].op) {
      case Nop:
        break;
      case PrintText:
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1d0,(bc->str)._M_dataplus._M_p,(bc->str)._M_string_length);
        break;
      case PrintValue:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        pbVar35 = *(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar35->m_type == string) {
          pbVar28 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::
                    get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                              (pbVar35);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1d0,(pbVar28->_M_dataplus)._M_p,pbVar28->_M_string_length);
        }
        else {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump((string_t *)local_278,pbVar35,-1,' ',false,strict);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1d0,(char *)local_278._0_8_,local_278._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ != &aStack_268) {
            operator_delete((void *)local_278._0_8_);
          }
        }
        pop_args(this,bc);
        break;
      case Push:
        pjVar18 = get_imm_abi_cxx11_(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,pjVar18);
        break;
      case Not:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = truthy(this,*(pvVar30->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        local_278[0] = !bVar15;
        goto LAB_001b02b6;
      case And:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = truthy(this,*(json **)local_278._0_8_);
        if (bVar15) {
          bVar15 = truthy(this,*(pointer *)(local_278._0_8_ + 8));
        }
        else {
          bVar15 = false;
        }
        local_298.boolean = bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case Or:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = truthy(this,*(json **)local_278._0_8_);
        bVar14 = true;
        if (!bVar15) {
          bVar14 = truthy(this,*(pointer *)(local_278._0_8_ + 8));
        }
        local_298.boolean = bVar14;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case In:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_208,pvVar30);
        local_d0 = *(json_value *)
                    &((local_208.array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        p_Stack_c8 = (_Base_ptr)0x0;
        pbStack_c0 = (pointer)0x0;
        nStack_b8 = -0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)&local_d0);
        local_f0 = *(json_value *)
                    &((local_208.array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        poStack_e8 = (object_t *)0x0;
        sStack_e0 = 0;
        uStack_d8 = 0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&local_f0);
        pvVar25 = ((local_208.array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        aStack_288._M_allocated_capacity = sStack_e0;
        aStack_288._8_8_ = uStack_d8;
        local_298 = local_f0;
        jStack_290.object = poStack_e8;
        local_2a8 = pbStack_c0;
        jStack_2a0.number_integer = nStack_b8;
        local_2b8 = local_d0;
        jStack_2b0.object = (object_t *)p_Stack_c8;
        bVar15 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_2b8,
                              (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_298);
        while (bVar15 == false) {
          aStack_268._M_allocated_capacity = (size_type)local_2a8;
          aStack_268._8_8_ = jStack_2a0;
          local_278._0_8_ = local_2b8;
          local_278._8_8_ = jStack_2b0;
          pbVar23 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)local_278);
          bVar15 = nlohmann::operator==(pbVar23,pvVar25);
          if (bVar15) break;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_2b8);
          bVar15 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_2b8,
                                (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_298);
        }
        local_1b8.m_value.array = jStack_2a0.array;
        local_1b8._0_8_ = local_2a8;
        local_1c8 = local_2b8;
        jStack_1c0 = jStack_2b0;
        local_278._0_8_ =
             *(json_value *)
              &((local_208.array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        local_278._8_8_ = (_Base_ptr)0x0;
        aStack_268._M_allocated_capacity = 0;
        aStack_268._8_8_ = (pointer)0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)local_278);
        bVar15 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_1c8,
                              (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_278);
        local_178 = (long *)CONCAT71(local_178._1_7_,!bVar15);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)&local_178);
        jVar41 = local_208;
        goto joined_r0x001afd8b;
      case Equal:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = nlohmann::operator==
                           (*(const_reference *)local_278._0_8_,*(pointer *)(local_278._0_8_ + 8));
        local_298.boolean = bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case Greater:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = nlohmann::operator<(*(pointer *)(local_278._0_8_ + 8),
                                     *(const_reference *)local_278._0_8_);
        local_298.boolean = bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case GreaterEqual:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = nlohmann::operator<(*(const_reference *)local_278._0_8_,
                                     *(pointer *)(local_278._0_8_ + 8));
        local_298.boolean = !bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case Less:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = nlohmann::operator<(*(const_reference *)local_278._0_8_,
                                     *(pointer *)(local_278._0_8_ + 8));
        local_298.boolean = bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case LessEqual:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = nlohmann::operator<(*(pointer *)(local_278._0_8_ + 8),
                                     *(const_reference *)local_278._0_8_);
        local_298.boolean = !bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
        goto LAB_001b041f;
      case Different:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        bVar15 = nlohmann::operator==
                           (*(const_reference *)local_278._0_8_,*(pointer *)(local_278._0_8_ + 8));
        local_298.boolean = !bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_298.boolean);
LAB_001b041f:
        if ((object_t *)local_278._0_8_ != (object_t *)0x0) {
          operator_delete((void *)local_278._0_8_);
        }
        break;
      case DivisibleBy:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     **)local_278._0_8_,(int *)&local_298.number_integer);
        uVar10 = local_298.number_integer._0_4_;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)((json_value *)(local_278._0_8_ + 8))->object,(int *)&local_298.number_integer
                  );
        uVar11 = local_298.number_integer._0_4_;
        pop_args(this,bc);
        local_298.boolean = uVar11 != 0 && (int)uVar10 % (int)uVar11 == 0;
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::emplace_back<bool>(this_02,&local_298.boolean);
        goto LAB_001b04c9;
      case Even:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(pvVar30->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,(int *)local_278);
        uVar37 = local_278[0];
        pop_args(this,bc);
        uVar37 = ~uVar37;
        goto LAB_001afe44;
      case First:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        local_278._0_8_ =
             *(json_value *)
              (pvVar30->
              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
        local_278._8_8_ = (_Base_ptr)0x0;
        aStack_268._M_allocated_capacity = 0;
        aStack_268._8_8_ = (pointer)0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)local_278);
        pbVar23 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_298,pbVar23);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_298);
        this_03 = &jStack_290;
        uVar37 = local_298.boolean;
        goto LAB_001b015f;
      case Float:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        pbVar28 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (*(pvVar30->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        poVar6 = (object_t *)(pbVar28->_M_dataplus)._M_p;
        puVar21 = (uint *)__errno_location();
        uVar43 = *puVar21;
        jVar41.number_integer._4_4_ = 0;
        jVar41.number_integer._0_4_ = uVar43;
        *puVar21 = 0;
        jVar46.number_float = strtod((char *)poVar6,(char **)local_278);
        if ((object_t *)local_278._0_8_ == poVar6) goto LAB_001b0f95;
        if (*puVar21 == 0) {
          *puVar21 = uVar43;
        }
        else if (*puVar21 == 0x22) goto LAB_001b0fa1;
        local_278._0_8_ = jVar46.number_float;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<double&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(double *)local_278);
        break;
      case Int:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        pbVar28 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (*(pvVar30->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        poVar6 = (object_t *)(pbVar28->_M_dataplus)._M_p;
        puVar21 = (uint *)__errno_location();
        uVar43 = *puVar21;
        jVar41.number_integer._4_4_ = 0;
        jVar41.number_integer._0_4_ = uVar43;
        *puVar21 = 0;
        lVar22 = strtol((char *)poVar6,(char **)local_278,10);
        if ((object_t *)local_278._0_8_ != poVar6) {
          if (((int)lVar22 == lVar22) && (*puVar21 != 0x22)) {
            if (*puVar21 == 0) {
              *puVar21 = uVar43;
            }
            local_278._0_4_ = (int)lVar22;
            pop_args(this,bc);
            std::
            vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
            ::emplace_back<int&>
                      ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                        *)this_02,(int *)local_278);
            break;
          }
LAB_001b0f7d:
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
LAB_001b0f95:
        std::__throw_invalid_argument("stod");
LAB_001b0fa1:
        uVar31 = std::__throw_out_of_range("stod");
        if (local_298.object != jVar41.object) {
          operator_delete(local_298.object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ != &aStack_268) {
          operator_delete((void *)local_278._0_8_);
        }
        _Unwind_Resume(uVar31);
      case Last:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        pvVar25 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::back(*(pvVar30->
                          super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_278,pvVar25);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_278);
        this_03 = (json_value *)(local_278 + 8);
        uVar37 = local_278[0];
LAB_001b015f:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&this_03->boolean,uVar37);
        break;
      case Length:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        pbVar35 = *(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        vVar2 = pbVar35->m_type;
        local_278._1_7_ = 0;
        local_278[0] = vVar2;
        if (vVar2 != null) {
          if (vVar2 == object) {
            local_278._0_8_ =
                 *(json_value *)
                  ((long)&(((pbVar35->m_value).object)->_M_t)._M_impl.super__Rb_tree_header + 0x20);
          }
          else if (vVar2 == array) {
            local_278._0_8_ =
                 (long)*(pointer *)
                        ((long)&(((pbVar35->m_value).array)->
                                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                                )._M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(((pbVar35->m_value).array)->
                           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           )._M_impl.super__Vector_impl_data >> 4;
          }
          else {
            local_278._0_8_ = (undefined1 (*) [16])0x1;
          }
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<unsigned_long&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(unsigned_long *)local_278);
        break;
      case Lower:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   *(pvVar30->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        uVar12 = local_278._8_8_;
        uVar31 = local_278._0_8_;
        if ((_Base_ptr)local_278._8_8_ != (_Base_ptr)0x0) {
          lVar22 = 0;
          do {
            iVar16 = tolower((int)*(char *)(uVar31 + lVar22));
            *(char *)(uVar31 + lVar22) = (char)iVar16;
            lVar22 = lVar22 + 1;
          } while (uVar12 != lVar22);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        goto LAB_001af7c7;
      case Max:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_298,pvVar30);
        local_50.m_object =
             ((local_298.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_50.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
        local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin(&local_50);
        local_70.m_object =
             ((local_298.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_70.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
        local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end(&local_70);
        std::
        __max_element<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_278);
        pbVar23 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_2b8,pbVar23);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_2b8);
        goto LAB_001af9ae;
      case Min:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_298,pvVar30);
        local_90.m_object =
             ((local_298.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_90.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
        local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin(&local_90);
        local_b0.m_object =
             ((local_298.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_b0.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
        local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end(&local_b0);
        std::
        __min_element<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_278);
        pbVar23 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_2b8,pbVar23);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_2b8);
LAB_001af9ae:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_2b8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&jStack_2b0.boolean,local_2b8.boolean);
        bVar15 = local_298.object == (object_t *)0x0;
        jVar41 = local_298;
        goto LAB_001af9d0;
      case Odd:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(pvVar30->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,(int *)local_278);
        uVar37 = local_278[0];
        pop_args(this,bc);
LAB_001afe44:
        local_278._0_8_ = CONCAT71(local_278._1_7_,uVar37) & 0xffffffffffffff01;
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::emplace_back<bool>(this_02,(bool *)local_278);
        break;
      case Range:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(pvVar30->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,(int *)local_278);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_278,(long)(int)local_278._0_4_,
                   (allocator_type *)&local_298.boolean);
        if (local_278._0_8_ != local_278._8_8_) {
          uVar33 = (local_278._8_8_ - local_278._0_8_) - 4;
          auVar49._8_4_ = (int)uVar33;
          auVar49._0_8_ = uVar33;
          auVar49._12_4_ = (int)(uVar33 >> 0x20);
          auVar47._0_8_ = uVar33 >> 2;
          auVar47._8_8_ = auVar49._8_8_ >> 2;
          uVar20 = 0;
          do {
            iVar16 = (int)uVar20;
            auVar48._8_4_ = iVar16;
            auVar48._0_8_ = uVar20;
            auVar48._12_4_ = (int)(uVar20 >> 0x20);
            auVar49 = auVar47 ^ _DAT_00484b00;
            auVar52 = (_DAT_00484af0 | auVar48) ^ _DAT_00484b00;
            iVar50 = auVar49._4_4_;
            if ((bool)(~(auVar52._4_4_ == iVar50 && auVar49._0_4_ < auVar52._0_4_ ||
                        iVar50 < auVar52._4_4_) & 1)) {
              *(int *)(local_278._0_8_ + uVar20 * 4) = iVar16;
            }
            if ((auVar52._12_4_ != auVar49._12_4_ || auVar52._8_4_ <= auVar49._8_4_) &&
                auVar52._12_4_ <= auVar49._12_4_) {
              *(int *)(local_278._0_8_ + uVar20 * 4 + 4) = iVar16 + 1;
            }
            auVar48 = (auVar48 | _DAT_00484ae0) ^ _DAT_00484b00;
            iVar51 = auVar48._4_4_;
            if (iVar51 <= iVar50 && (iVar51 != iVar50 || auVar48._0_4_ <= auVar49._0_4_)) {
              *(int *)(local_278._0_8_ + uVar20 * 4 + 8) = iVar16 + 2;
              *(int *)(local_278._0_8_ + uVar20 * 4 + 0xc) = iVar16 + 3;
            }
            uVar20 = uVar20 + 4;
          } while (((uVar33 >> 2) + 4 & 0x7ffffffffffffffc) != uVar20);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(vector<int,_std::allocator<int>_> *)local_278);
LAB_001b04c9:
        jVar41 = (json_value)local_278._0_8_;
        if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_278._0_8_ ==
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)0x0) break;
        goto LAB_001b054c;
      default:
        local_278._0_8_ = &aStack_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"render_error","");
        OVar3 = bc->op;
        cVar38 = '\x03' - (OVar3 < 100);
        if (OVar3 < GreaterEqual) {
          cVar38 = '\x01';
        }
        local_2b8.object = (object_t *)&local_2a8;
        std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar38);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_2b8.object,jStack_2b0.number_unsigned._0_4_,(uint)OVar3);
        puVar26 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x487fce);
        local_298.object = (object_t *)&aStack_288;
        pbVar35 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(puVar26 + 2);
        if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)*puVar26 == pbVar35) {
          aStack_288._M_allocated_capacity = *(undefined8 *)pbVar35;
          aStack_288._8_8_ = puVar26[3];
        }
        else {
          aStack_288._M_allocated_capacity = *(undefined8 *)pbVar35;
          local_298.array = ((array_t *)*puVar26).array;
        }
        jStack_290 = *(json_value *)(puVar26 + 1);
        *puVar26 = pbVar35;
        puVar26[1] = 0;
        *(undefined1 *)(puVar26 + 2) = 0;
        inja_throw((string *)local_278,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.object != &aStack_288) {
          operator_delete(local_298.object);
        }
        if (local_2b8.object != (object_t *)&local_2a8) {
          operator_delete(local_2b8.object);
        }
        jVar41 = (json_value)local_278._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ == &aStack_268) break;
        goto LAB_001b054c;
      case Round:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_278,pvVar30);
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                  (*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     **)local_278._0_8_,&local_298.number_float);
        local_1e8.array = local_298.array;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)((json_value *)(local_278._0_8_ + 8))->object,(int *)&local_298.number_integer
                  );
        local_1d8.number_float = (number_float_t)(int)local_298.number_integer._0_4_;
        pop_args(this,bc);
        dVar45 = pow(10.0,local_1d8.number_float);
        local_1e8.number_float = round(dVar45 * local_1e8.number_float);
        dVar45 = pow(10.0,local_1d8.number_float);
        local_298.number_float = local_1e8.number_float / dVar45;
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::emplace_back<double>(this_02,&local_298.number_float);
        jVar41 = (json_value)local_278._0_8_;
        goto joined_r0x001afd8b;
      case Sort:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_0>
                  ((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_278,
                   *(pvVar30->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        uVar12 = local_278._8_8_;
        uVar31 = local_278._0_8_;
        if (local_278._0_8_ != local_278._8_8_) {
          uVar33 = (long)(local_278._8_8_ - local_278._0_8_) >> 4;
          lVar22 = 0x3f;
          if (uVar33 != 0) {
            for (; uVar33 >> lVar22 == 0; lVar22 = lVar22 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_278._0_8_,local_278._8_8_,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (uVar31,uVar12);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_278);
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~vector((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)local_278);
        break;
      case Upper:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   *(pvVar30->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        uVar12 = local_278._8_8_;
        uVar31 = local_278._0_8_;
        if ((_Base_ptr)local_278._8_8_ != (_Base_ptr)0x0) {
          lVar22 = 0;
          do {
            iVar16 = toupper((int)*(char *)(uVar31 + lVar22));
            *(char *)(uVar31 + lVar22) = (char)iVar16;
            lVar22 = lVar22 + 1;
          } while (uVar12 != lVar22);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
LAB_001af7c7:
        bVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_278._0_8_ == &aStack_268;
        jVar41 = (json_value)local_278._0_8_;
LAB_001af9d0:
        if (!bVar15) {
          operator_delete(jVar41.object);
        }
        break;
      case Exists:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        pbVar28 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (*(pvVar30->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        pjVar18 = local_1a0;
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_278,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    *)local_1a0,pbVar28);
        local_298.object = (object_t *)pjVar18;
        jStack_290.object = (object_t *)0x0;
        aStack_288._M_allocated_capacity = 0;
        aStack_288._8_8_ = 0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&local_298);
        bVar15 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((const_iterator *)local_278,
                              (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_298);
        local_278[0] = !bVar15;
        pop_args(this,bc);
        goto LAB_001b02d3;
      case ExistsInObject:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_2b8,pvVar30);
        pbVar28 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)((json_value *)
                                &((local_2b8.array)->
                                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish)->object);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_278,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    *)((local_2b8.array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,pbVar28);
        local_298.object =
             (object_t *)
             ((local_2b8.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        jStack_290.object = (object_t *)0x0;
        aStack_288._M_allocated_capacity = 0;
        aStack_288._8_8_ = 0x8000000000000000;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&local_298);
        bVar15 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_278,
                              (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_298);
        local_1c8.boolean = !bVar15;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,&local_1c8.boolean);
        jVar41 = local_2b8;
joined_r0x001afd8b:
        if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)jVar41.object !=
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)0x0) {
LAB_001b054c:
          operator_delete(jVar41.object);
        }
        break;
      case IsBoolean:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (*(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == boolean;
        goto LAB_001b02aa;
      case IsNumber:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (byte)((*(pvVar30->
                          super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start)->m_type - number_integer) < 3;
        goto LAB_001af281;
      case IsInteger:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (byte)((*(pvVar30->
                          super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start)->m_type - number_integer) < 2;
LAB_001af281:
        local_278[0] = bVar15;
        goto LAB_001b02b6;
      case IsFloat:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (*(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == number_float;
        goto LAB_001b02aa;
      case IsObject:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (*(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == object;
        goto LAB_001b02aa;
      case IsArray:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (*(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == array;
        goto LAB_001b02aa;
      case IsString:
        pvVar30 = get_args_abi_cxx11_(this,bc);
        bVar15 = (*(pvVar30->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == string;
LAB_001b02aa:
        local_278[0] = bVar15;
LAB_001b02b6:
        pop_args(this,bc);
LAB_001b02d3:
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_278);
        break;
      case Default:
        pjVar18 = get_imm_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_120,pjVar18);
        pbVar4 = (this->m_stack).
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_120);
        vVar2 = pbVar4[-1].m_type;
        pbVar4[-1].m_type = local_120[0];
        jVar41 = pbVar4[-1].m_value;
        pbVar4[-1].m_value = local_118;
        local_120[0] = vVar2;
        local_118 = jVar41;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar4 + -1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_120);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_120 + 8),local_120[0]);
        break;
      case Include:
        Renderer((Renderer *)local_278,this->m_included_templates,this->m_callbacks);
        this_00 = &this->m_included_templates->_M_t;
        pjVar18 = get_imm_abi_cxx11_(this,bc);
        pbVar28 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (pjVar18);
        cVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
                 ::find(this_00,pbVar28);
        render_to((Renderer *)local_278,local_1d0,(Template *)(cVar19._M_node + 2),local_1a0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_218);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_218 + 8),local_218[0]);
        if (local_230 != (pointer)0x0) {
          operator_delete(local_230);
        }
        std::vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>::~vector
                  (&local_250);
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~vector((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)&aStack_268);
        break;
      case Callback:
        name.data_ = (bc->str)._M_dataplus._M_p;
        name.size_ = (bc->str)._M_string_length;
        FunctionStorage::find_callback_abi_cxx11_
                  ((CallbackFunction *)local_278,this->m_callbacks,name,
                   *(uint *)&bc->field_0x4 & 0x3fffffff);
        if ((pointer)aStack_268._M_allocated_capacity == (pointer)0x0) {
          local_298.object = (object_t *)&aStack_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"render_error","");
          local_140[0] = local_130;
          pcVar7 = (bc->str)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_140,pcVar7,pcVar7 + (bc->str)._M_string_length);
          plVar24 = (long *)std::__cxx11::string::replace((ulong)local_140,0,(char *)0x0,0x487f68);
          local_178 = &local_168;
          plVar34 = plVar24 + 2;
          if ((long *)*plVar24 == plVar34) {
            local_168 = *plVar34;
            lStack_160 = plVar24[3];
          }
          else {
            local_168 = *plVar34;
            local_178 = (long *)*plVar24;
          }
          local_170 = plVar24[1];
          *plVar24 = (long)plVar34;
          plVar24[1] = 0;
          *(undefined1 *)(plVar24 + 2) = 0;
          puVar26 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          pbVar35 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(puVar26 + 2);
          if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)*puVar26 == pbVar35) {
            local_1f8 = *(pointer *)pbVar35;
            uStack_1f0 = puVar26[3];
            local_208.object = jVar41.object;
          }
          else {
            local_1f8 = *(pointer *)pbVar35;
            local_208.array = ((array_t *)*puVar26).array;
          }
          local_200 = puVar26[1];
          *puVar26 = pbVar35;
          puVar26[1] = 0;
          *(undefined1 *)(puVar26 + 2) = 0;
          uVar43 = *(uint *)&bc->field_0x4 & 0x3fffffff;
          cVar38 = '\x01';
          if (9 < uVar43) {
            uVar32 = uVar43;
            cVar13 = '\x04';
            do {
              cVar38 = cVar13;
              if (uVar32 < 100) {
                cVar38 = cVar38 + -2;
                goto LAB_001b0c9a;
              }
              if (uVar32 < 1000) {
                cVar38 = cVar38 + -1;
                goto LAB_001b0c9a;
              }
              if (uVar32 < 10000) goto LAB_001b0c9a;
              bVar15 = 99999 < uVar32;
              uVar32 = uVar32 / 10000;
              cVar13 = cVar38 + '\x04';
            } while (bVar15);
            cVar38 = cVar38 + '\x01';
          }
LAB_001b0c9a:
          local_198 = local_188;
          std::__cxx11::string::_M_construct((ulong)&local_198,cVar38);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_198,local_190,uVar43);
          ppbVar42 = (pointer)0xf;
          if (local_208.object != jVar41.object) {
            ppbVar42 = local_1f8;
          }
          ppbVar1 = (pointer)(CONCAT44(uStack_18c,local_190) + local_200);
          if (ppbVar42 < ppbVar1) {
            ppbVar42 = (pointer)0xf;
            if (local_198 != local_188) {
              ppbVar42 = local_188[0];
            }
            if (ppbVar42 < ppbVar1) goto LAB_001b0d2c;
            plVar24 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_198,0,(char *)0x0,local_208.number_unsigned);
          }
          else {
LAB_001b0d2c:
            plVar24 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_208.number_integer,(ulong)local_198);
          }
          local_1c8.object = (object_t *)&local_1b8;
          pbVar35 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(plVar24 + 2);
          if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)*plVar24 == pbVar35) {
            local_1b8 = *pbVar35;
          }
          else {
            local_1b8.m_type = pbVar35->m_type;
            local_1b8._1_7_ = *(undefined7 *)&pbVar35->field_0x1;
            local_1c8.array = ((array_t *)*plVar24).array;
          }
          jStack_1c0 = *(json_value *)(plVar24 + 1);
          *plVar24 = (long)pbVar35;
          plVar24[1] = 0;
          pbVar35->m_type = null;
          puVar26 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8.number_integer);
          pbVar35 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(puVar26 + 2);
          if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)*puVar26 == pbVar35) {
            local_2a8 = *(pointer *)pbVar35;
            jStack_2a0 = *(json_value *)(puVar26 + 3);
            local_2b8.object = (object_t *)&local_2a8;
          }
          else {
            local_2a8 = *(pointer *)pbVar35;
            local_2b8.array = ((array_t *)*puVar26).array;
          }
          jStack_2b0 = *(json_value *)(puVar26 + 1);
          *puVar26 = pbVar35;
          puVar26[1] = 0;
          *(undefined1 *)(puVar26 + 2) = 0;
          inja_throw((string *)&local_298,(string *)&local_2b8);
          if (local_2b8.object != (object_t *)&local_2a8) {
            operator_delete(local_2b8.object);
          }
          if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_1c8.object != &local_1b8) {
            operator_delete(local_1c8.object);
          }
          if (local_198 != local_188) {
            operator_delete(local_198);
          }
          if (local_208.object != jVar41.object) {
            operator_delete(local_208.object);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178);
          }
          if (local_140[0] != local_130) {
            operator_delete(local_140[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.object != &aStack_288) {
            operator_delete(local_298.object);
          }
        }
        pvVar30 = get_args_abi_cxx11_(this,bc);
        if ((pointer)aStack_268._M_allocated_capacity == (pointer)0x0) {
          std::__throw_bad_function_call();
          goto LAB_001b0f7d;
        }
        (*(code *)aStack_268._8_8_)(&local_298,local_278,pvVar30);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&jStack_290.boolean,local_298.boolean);
        if ((pointer)aStack_268._M_allocated_capacity != (pointer)0x0) {
          (*(code *)aStack_268._M_allocated_capacity)(local_278,local_278,3);
        }
        break;
      case Jump:
switchD_001aedfc_caseD_2a:
        uVar44 = (ulong)(*(uint *)&bc->field_0x4 & 0x3fffffff) - 1;
        break;
      case ConditionalJump:
        bVar15 = truthy(this,(this->m_stack).
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
        if (!bVar15) {
          uVar44 = (ulong)(*(uint *)&bc->field_0x4 & 0x3fffffff) - 1;
        }
        pbVar4 = (this->m_stack).
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->m_stack).
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar4 + -1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&pbVar4[-1].m_value.boolean,pbVar4[-1].m_type);
        break;
      case StartLoop:
        pbVar4 = (this->m_stack).
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        vVar2 = pbVar4[-1].m_type;
        if (vVar2 != null) {
          if (vVar2 == array) {
            if (((pbVar4[-1].m_value.array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_start !=
                ((pbVar4[-1].m_value.array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001b0567;
          }
          else if ((vVar2 != object) ||
                  (((pbVar4[-1].m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                   != 0)) {
LAB_001b0567:
            std::vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>::
            emplace_back<>((vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                            *)local_1e0);
            pLVar39 = (this->m_loop_stack).
                      super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            sVar9 = (bc->str)._M_string_length;
            pLVar39[-1].value_name.data_ = (bc->str)._M_dataplus._M_p;
            pLVar39[-1].value_name.size_ = sVar9;
            pbVar4 = (this->m_stack).
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_100[0] = pbVar4[-1].m_type;
            local_f8 = pbVar4[-1].m_value;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(pbVar4 + -1);
            pbVar4[-1].m_type = null;
            pbVar4[-1].m_value.object = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_100);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_100);
            vVar2 = pLVar39[-1].values.m_type;
            pLVar39[-1].values.m_type = local_100[0];
            jVar41 = pLVar39[-1].values.m_value;
            pLVar39[-1].values.m_value = local_f8;
            local_1d8 = (json_value)&pLVar39[-1].values;
            local_100[0] = vVar2;
            local_f8 = jVar41;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(&pLVar39[-1].values);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_100);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_100 + 8),local_100[0]);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_110,this->m_data);
            jVar41.object = (object_t *)&pLVar39[-1].data;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_110);
            vVar2 = pLVar39[-1].data.m_type;
            pLVar39[-1].data.m_type = local_110[0];
            jVar46 = pLVar39[-1].data.m_value;
            pLVar39[-1].data.m_value = local_108;
            local_110[0] = vVar2;
            local_108 = jVar46;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)jVar41.object);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_110);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_110 + 8),local_110[0]);
            pbVar4 = (this->m_stack).
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            (this->m_stack).
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(pbVar4 + -1);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)&pbVar4[-1].m_value.boolean,pbVar4[-1].m_type);
            vVar2 = pLVar39[-1].values.m_type;
            if ((bc->value).m_type == string) {
              if (vVar2 != object) {
                pLVar40 = (this->m_loop_stack).
                          super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1;
                (this->m_loop_stack).
                super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                ._M_impl.super__Vector_impl_data._M_finish = pLVar40;
                __gnu_cxx::new_allocator<inja::Renderer::LoopLevel>::
                destroy<inja::Renderer::LoopLevel>(local_1e0,pLVar40);
                local_278._0_8_ = &aStack_268;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,"render_error","");
                local_298.object = (object_t *)&aStack_288;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_298,"for key, value requires object","");
                inja_throw((string *)local_278,(string *)&local_298);
                if (local_298.object != (object_t *)&aStack_288) {
                  operator_delete(local_298.object);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._0_8_ != &aStack_268) {
                  operator_delete((void *)local_278._0_8_);
                }
              }
              pLVar39[-1].loop_type = Map;
              local_1e8 = jVar41;
              pbVar28 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::
                        get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                                  (&bc->value);
              jVar41 = local_1d8;
              sVar9 = pbVar28->_M_string_length;
              pLVar39[-1].key_name.data_ = (pbVar28->_M_dataplus)._M_p;
              pLVar39[-1].key_name.size_ = sVar9;
              local_278._0_8_ = local_1d8;
              local_278._8_8_ = (_Base_ptr)0x0;
              aStack_268._M_allocated_capacity = 0;
              aStack_268._8_8_ = (pointer)0x8000000000000000;
              nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_278);
              local_298 = jVar41;
              jStack_290.object = (object_t *)0x0;
              aStack_288._M_allocated_capacity = 0;
              aStack_288._8_8_ = 0x8000000000000000;
              nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&local_298);
              bVar15 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_278,
                                    (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)&local_298);
              if (!bVar15) {
                do {
                  __args = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)local_278);
                  local_2b8.object =
                       (object_t *)
                       nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                    *)local_278);
                  std::
                  vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>
                  ::
                  emplace_back<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>
                            ((vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>
                              *)&pLVar39[-1].map_values,__args,
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              **)&local_2b8.object);
                  nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)local_278);
                  bVar15 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                         *)local_278,
                                        (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                         *)&local_298);
                } while (!bVar15);
              }
              ppVar36 = pLVar39[-1].map_values.
                        super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar8 = pLVar39[-1].map_values.
                       super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (ppVar36 != ppVar8) {
                uVar33 = ((long)ppVar8 - (long)ppVar36 >> 3) * -0x5555555555555555;
                lVar22 = 0x3f;
                if (uVar33 != 0) {
                  for (; uVar33 >> lVar22 == 0; lVar22 = lVar22 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>*,std::vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<inja::Renderer::render_to(std::ostream&,inja::Template_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)::_lambda(std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&,std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&)_1_>>
                          (ppVar36,ppVar8,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>*,std::vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<inja::Renderer::render_to(std::ostream&,inja::Template_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)::_lambda(std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&,std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&)_1_>>
                          (ppVar36,ppVar8);
                ppVar36 = pLVar39[-1].map_values.
                          super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              pLVar39[-1].map_it._M_current = ppVar36;
              jVar41 = local_1e8;
            }
            else {
              if (vVar2 == array) {
                pLVar39[-1].loop_type = Array;
                pLVar39[-1].index = 0;
LAB_001b08b1:
                paVar5 = pLVar39[-1].values.m_value.array;
                uVar33 = (long)(paVar5->
                               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(paVar5->
                               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4;
              }
              else {
                pLVar40 = (this->m_loop_stack).
                          super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1;
                (this->m_loop_stack).
                super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                ._M_impl.super__Vector_impl_data._M_finish = pLVar40;
                __gnu_cxx::new_allocator<inja::Renderer::LoopLevel>::
                destroy<inja::Renderer::LoopLevel>(local_1e0,pLVar40);
                local_278._0_8_ = &aStack_268;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,"render_error","");
                local_298.object = (object_t *)&aStack_288;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_298,"type must be array","");
                inja_throw((string *)local_278,(string *)&local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298.object != &aStack_288) {
                  operator_delete(local_298.object);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._0_8_ != &aStack_268) {
                  operator_delete((void *)local_278._0_8_);
                }
                vVar2 = pLVar39[-1].values.m_type;
                uVar33 = (ulong)vVar2;
                pLVar39[-1].loop_type = Array;
                pLVar39[-1].index = 0;
                if (vVar2 != null) {
                  if (vVar2 == object) {
                    uVar33 = ((pLVar39[-1].values.m_value.object)->_M_t)._M_impl.
                             super__Rb_tree_header._M_node_count;
                  }
                  else {
                    if (vVar2 == array) goto LAB_001b08b1;
                    uVar33 = 1;
                  }
                }
              }
              pLVar39[-1].size = uVar33;
            }
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::find<char_const(&)[5]>
                      ((iterator *)local_278,
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)jVar41.object,(char (*) [5])"loop");
            jStack_290.object = (object_t *)0x0;
            aStack_288._M_allocated_capacity = 0;
            aStack_288._8_8_ = 0x8000000000000000;
            local_298 = jVar41;
            nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)&local_298);
            bVar15 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator==((iterator *)local_278,
                                  (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&local_298);
            if (!bVar15) {
              pbVar29 = nlohmann::detail::
                        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_278);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_298,pbVar29);
              local_150[0] = local_298.boolean;
              local_148 = jStack_290;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&local_298);
              local_298.number_unsigned = local_298.number_unsigned & 0xffffffffffffff00;
              jStack_290.object = (object_t *)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_150);
              pbVar29 = nlohmann::detail::
                        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_278);
              this_01 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)pbVar29,"parent");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_150);
              vVar2 = this_01->m_type;
              this_01->m_type = local_150[0];
              jVar46 = this_01->m_value;
              this_01->m_value = local_148;
              local_150[0] = vVar2;
              local_148 = jVar46;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(this_01);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_150);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)(local_150 + 8),local_150[0]);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&local_298);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&jStack_290.boolean,local_298.boolean);
            }
            this->m_data = (json *)jVar41;
            update_loop_data(this);
            break;
          }
        }
        (this->m_stack).
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar4 + -1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&pbVar4[-1].m_value.boolean,pbVar4[-1].m_type);
        uVar44 = (ulong)(*(uint *)&bc->field_0x4 & 0x3fffffff);
        break;
      case EndLoop:
        pLVar39 = (this->m_loop_stack).
                  super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->m_loop_stack).
            super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
            ._M_impl.super__Vector_impl_data._M_start == pLVar39) {
          local_278._0_8_ = &aStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"render_error","");
          local_298.object = (object_t *)&aStack_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,"unexpected state in renderer","");
          inja_throw((string *)local_278,(string *)&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.object != &aStack_288) {
            operator_delete(local_298.object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ != &aStack_268) {
            operator_delete((void *)local_278._0_8_);
          }
          pLVar39 = (this->m_loop_stack).
                    super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pLVar39[-1].loop_type == Array) {
          uVar20 = pLVar39[-1].index + 1;
          pLVar39[-1].index = uVar20;
          vVar2 = pLVar39[-1].values.m_type;
          uVar33 = (ulong)vVar2;
          if (vVar2 != null) {
            if (vVar2 == object) {
              uVar33 = ((pLVar39[-1].values.m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
            }
            else if (vVar2 == array) {
              paVar5 = pLVar39[-1].values.m_value.array;
              uVar33 = (long)(paVar5->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar5->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
            }
            else {
              uVar33 = 1;
            }
          }
          if (uVar20 != uVar33) {
LAB_001b0450:
            update_loop_data(this);
            goto switchD_001aedfc_caseD_2a;
          }
        }
        else {
          ppVar27 = pLVar39[-1].map_it._M_current + 1;
          pLVar39[-1].map_it._M_current = ppVar27;
          if (ppVar27 !=
              pLVar39[-1].map_values.
              super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001b0450;
        }
        (this->m_loop_stack).
        super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLVar39 + -1;
        __gnu_cxx::new_allocator<inja::Renderer::LoopLevel>::destroy<inja::Renderer::LoopLevel>
                  (local_1e0,pLVar39 + -1);
        pLVar39 = (this->m_loop_stack).
                  super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pjVar18 = &pLVar39[-1].data;
        if ((this->m_loop_stack).
            super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
            ._M_impl.super__Vector_impl_data._M_start == pLVar39) {
          pjVar18 = local_1a0;
        }
        this->m_data = pjVar18;
      }
      uVar44 = uVar44 + 1;
      pBVar17 = (local_158->bytecodes).
                super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar44 < (ulong)(((long)(local_158->bytecodes).
                                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar17 >> 3
                              ) * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void render_to(std::ostream& os, const Template& tmpl, const json& data) {
		m_data = &data;

		for (size_t i = 0; i < tmpl.bytecodes.size(); ++i) {
			const auto& bc = tmpl.bytecodes[i];

			switch (bc.op) {
				case Bytecode::Op::Nop: {
					break;
				}
				case Bytecode::Op::PrintText: {
					os << bc.str;
					break;
				}
				case Bytecode::Op::PrintValue: {
					const json& val = *get_args(bc)[0];
					if (val.is_string())
						os << val.get_ref<const std::string&>();
					else
						os << val.dump();
					// val.dump(os);
					pop_args(bc);
					break;
				}
				case Bytecode::Op::Push: {
					m_stack.emplace_back(*get_imm(bc));
					break;
				}
				case Bytecode::Op::Upper: {
					auto result = get_args(bc)[0]->get<std::string>();
					std::transform(result.begin(), result.end(), result.begin(), ::toupper);
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Lower: {
					auto result = get_args(bc)[0]->get<std::string>();
					std::transform(result.begin(), result.end(), result.begin(), ::tolower);
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Range: {
					int number = get_args(bc)[0]->get<int>();
					std::vector<int> result(number);
					std::iota(std::begin(result), std::end(result), 0);
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Length: {
					auto result = get_args(bc)[0]->size();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Sort: {
					auto result = get_args(bc)[0]->get<std::vector<json>>();
					std::sort(result.begin(), result.end());
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::First: {
					auto result = get_args(bc)[0]->front();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Last: {
					auto result = get_args(bc)[0]->back();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Round: {
					auto args = get_args(bc);
					double number = args[0]->get<double>();
					int precision = args[1]->get<int>();
					pop_args(bc);
					m_stack.emplace_back(std::round(number * std::pow(10.0, precision)) / std::pow(10.0, precision));
					break;
				}
				case Bytecode::Op::DivisibleBy: {
					auto args = get_args(bc);
					int number = args[0]->get<int>();
					int divisor = args[1]->get<int>();
					pop_args(bc);
					m_stack.emplace_back((divisor != 0) && (number % divisor == 0));
					break;
				}
				case Bytecode::Op::Odd: {
					int number = get_args(bc)[0]->get<int>();
					pop_args(bc);
					m_stack.emplace_back(number % 2 != 0);
					break;
				}
				case Bytecode::Op::Even: {
					int number = get_args(bc)[0]->get<int>();
					pop_args(bc);
					m_stack.emplace_back(number % 2 == 0);
					break;
				}
				case Bytecode::Op::Max: {
					auto args = get_args(bc);
					auto result = *std::max_element(args[0]->begin(), args[0]->end());
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Min: {
					auto args = get_args(bc);
					auto result = *std::min_element(args[0]->begin(), args[0]->end());
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Not: {
					bool result = !truthy(*get_args(bc)[0]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::And: {
					auto args = get_args(bc);
					bool result = truthy(*args[0]) && truthy(*args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Or: {
					auto args = get_args(bc);
					bool result = truthy(*args[0]) || truthy(*args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::In: {
					auto args = get_args(bc);
					bool result = std::find(args[1]->begin(), args[1]->end(), *args[0]) != args[1]->end();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Equal: {
					auto args = get_args(bc);
					bool result = (*args[0] == *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Greater: {
					auto args = get_args(bc);
					bool result = (*args[0] > *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Less: {
					auto args = get_args(bc);
					bool result = (*args[0] < *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::GreaterEqual: {
					auto args = get_args(bc);
					bool result = (*args[0] >= *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::LessEqual: {
					auto args = get_args(bc);
					bool result = (*args[0] <= *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Different: {
					auto args = get_args(bc);
					bool result = (*args[0] != *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Float: {
					double result = std::stod(get_args(bc)[0]->get_ref<const std::string&>());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Int: {
					int result = std::stoi(get_args(bc)[0]->get_ref<const std::string&>());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Exists: {
					auto&& name = get_args(bc)[0]->get_ref<const std::string&>();
					bool result = (data.find(name) != data.end());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::ExistsInObject: {
					auto args = get_args(bc);
					auto&& name = args[1]->get_ref<const std::string&>();
					bool result = (args[0]->find(name) != args[0]->end());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsBoolean: {
					bool result = get_args(bc)[0]->is_boolean();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsNumber: {
					bool result = get_args(bc)[0]->is_number();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsInteger: {
					bool result = get_args(bc)[0]->is_number_integer();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsFloat: {
					bool result = get_args(bc)[0]->is_number_float();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsObject: {
					bool result = get_args(bc)[0]->is_object();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsArray: {
					bool result = get_args(bc)[0]->is_array();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsString: {
					bool result = get_args(bc)[0]->is_string();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Default: {
					// default needs to be a bit "magic"; we can't evaluate the first
					// argument during the push operation, so we swap the arguments during
					// the parse phase so the second argument is pushed on the stack and
					// the first argument is in the immediate
					try {
						const json* imm = get_imm(bc);
						// if no exception was raised, replace the stack value with it
						m_stack.back() = *imm;
					} catch (std::exception&) {
						// couldn't read immediate, just leave the stack as is
					}
					break;
				}
				case Bytecode::Op::Include:
					Renderer(m_included_templates, m_callbacks)
						.render_to(os, m_included_templates.find(get_imm(bc)->get_ref<const std::string&>())->second,
								   data);
					break;
				case Bytecode::Op::Callback: {
					auto callback = m_callbacks.find_callback(bc.str, bc.args);
					if (!callback) {
						inja_throw("render_error", "function '" + static_cast<std::string>(bc.str) + "' (" +
													   std::to_string(static_cast<unsigned int>(bc.args)) +
													   ") not found");
					}
					json result = callback(get_args(bc));
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Jump: {
					i = bc.args - 1;  // -1 due to ++i in loop
					break;
				}
				case Bytecode::Op::ConditionalJump: {
					if (!truthy(m_stack.back())) {
						i = bc.args - 1;  // -1 due to ++i in loop
					}
					m_stack.pop_back();
					break;
				}
				case Bytecode::Op::StartLoop: {
					// jump past loop body if empty
					if (m_stack.back().empty()) {
						m_stack.pop_back();
						i = bc.args;  // ++i in loop will take it past EndLoop
						break;
					}

					m_loop_stack.emplace_back();
					LoopLevel& level = m_loop_stack.back();
					level.value_name = bc.str;
					level.values = std::move(m_stack.back());
					level.data = (*m_data);
					m_stack.pop_back();

					if (bc.value.is_string()) {
						// map iterator
						if (!level.values.is_object()) {
							m_loop_stack.pop_back();
							inja_throw("render_error", "for key, value requires object");
						}
						level.loop_type = LoopLevel::Type::Map;
						level.key_name = bc.value.get_ref<const std::string&>();

						// sort by key
						for (auto it = level.values.begin(), end = level.values.end(); it != end; ++it) {
							level.map_values.emplace_back(it.key(), &it.value());
						}
						std::sort(level.map_values.begin(), level.map_values.end(),
								  [](const LoopLevel::KeyValue& a, const LoopLevel::KeyValue& b) {
									  return a.first < b.first;
								  });
						level.map_it = level.map_values.begin();
					} else {
						if (!level.values.is_array()) {
							m_loop_stack.pop_back();
							inja_throw("render_error", "type must be array");
						}

						// list iterator
						level.loop_type = LoopLevel::Type::Array;
						level.index = 0;
						level.size = level.values.size();
					}

					// provide parent access in nested loop
					auto parent_loop_it = level.data.find("loop");
					if (parent_loop_it != level.data.end()) {
						json loop_copy = *parent_loop_it;
						(*parent_loop_it)["parent"] = std::move(loop_copy);
					}

					// set "current" data to loop data
					m_data = &level.data;
					update_loop_data();
					break;
				}
				case Bytecode::Op::EndLoop: {
					if (m_loop_stack.empty()) {
						inja_throw("render_error", "unexpected state in renderer");
					}
					LoopLevel& level = m_loop_stack.back();

					bool done;
					if (level.loop_type == LoopLevel::Type::Array) {
						level.index += 1;
						done = (level.index == level.values.size());
					} else {
						level.map_it += 1;
						done = (level.map_it == level.map_values.end());
					}

					if (done) {
						m_loop_stack.pop_back();
						// set "current" data to outer loop data or main data as appropriate
						if (!m_loop_stack.empty()) {
							m_data = &m_loop_stack.back().data;
						} else {
							m_data = &data;
						}
						break;
					}

					update_loop_data();

					// jump back to start of loop
					i = bc.args - 1;  // -1 due to ++i in loop
					break;
				}
				default: {
					inja_throw("render_error",
							   "unknown op in renderer: " + std::to_string(static_cast<unsigned int>(bc.op)));
				}
			}
		}
	}